

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O0

void write_zip(char *zipname,dir_tree_t *trees,int update)

{
  FILE *pFVar1;
  uint num_files_00;
  int iVar2;
  file_sorted_t *__ptr;
  int *piVar3;
  char *pcVar4;
  long lVar5;
  size_t sVar6;
  BYTE *local_1068;
  void *central_dir;
  FILE *ozip;
  FILE *zip;
  file_sorted_t *sorted;
  int num_files;
  int i;
  undefined2 local_1038;
  EndOfCentralDirectory dirend;
  char tempname [4096];
  int local_1c;
  int update_local;
  dir_tree_t *trees_local;
  char *zipname_local;
  
  central_dir = (void *)0x0;
  local_1068 = (BYTE *)0x0;
  num_files_00 = count_files(trees);
  __ptr = sort_files(trees,num_files_00);
  if (__ptr == (file_sorted_t *)0x0) {
    no_mem = 1;
  }
  else {
    local_1c = update;
    if (update != 0) {
      sprintf((char *)((long)&dirend.DirectorySize + 2),"%s.temp",zipname);
      central_dir = fopen(zipname,"rb");
      pFVar1 = _stderr;
      if ((FILE *)central_dir == (FILE *)0x0) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        fprintf(pFVar1,"Could not open %s for updating: %s\n",zipname,pcVar4);
        local_1c = 0;
      }
      else {
        local_1068 = find_central_dir((FILE *)central_dir);
        if (local_1068 == (BYTE *)0x0) {
          fprintf(_stderr,"Could not read central directory from %s. (Is it a zipfile?)\n",zipname);
          local_1c = 0;
        }
      }
      if (local_1c == 0) {
        fprintf(_stderr,"Will proceed as if -u had not been specified.\n");
      }
    }
    if (local_1c == 0) {
      ozip = (FILE *)fopen(zipname,"wb");
    }
    else {
      ozip = (FILE *)fopen((char *)((long)&dirend.DirectorySize + 2),"wb");
    }
    pFVar1 = _stderr;
    if (ozip == (FILE *)0x0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      fprintf(pFVar1,"Could not open %s: %s\n",zipname,pcVar4);
    }
    else {
      sorted._4_4_ = 0;
      while (((int)sorted._4_4_ < (int)num_files_00 &&
             (iVar2 = append_to_zip(ozip,__ptr + (int)sorted._4_4_,(FILE *)central_dir,local_1068),
             iVar2 == 0))) {
        sorted._4_4_ = sorted._4_4_ + 1;
      }
      if (sorted._4_4_ == num_files_00) {
        lVar5 = ftell((FILE *)ozip);
        dirend._8_4_ = SUB84(lVar5,0);
        for (sorted._4_4_ = 0; (int)sorted._4_4_ < (int)num_files_00;
            sorted._4_4_ = sorted._4_4_ + 1) {
          write_central_dir(ozip,__ptr + (int)sorted._4_4_);
        }
        stack0xffffffffffffefc2 = 0x6054b50;
        i._2_2_ = 0;
        local_1038 = 0;
        dirend.Magic._0_2_ = (undefined2)sorted._4_4_;
        dirend.Magic._2_2_ = (undefined2)dirend.Magic;
        lVar5 = ftell((FILE *)ozip);
        dirend._4_4_ = (int)lVar5 - dirend._8_4_;
        dirend.DirectorySize._0_2_ = 0;
        sVar6 = fwrite((void *)((long)&num_files + 2),0x16,1,(FILE *)ozip);
        pFVar1 = _stderr;
        if (sVar6 != 1) {
          piVar3 = __errno_location();
          pcVar4 = strerror(*piVar3);
          fprintf(pFVar1,"Failed writing zip directory terminator: %s\n",pcVar4);
        }
        printf("%s contains %d files (updated %d)\n",zipname,(ulong)num_files_00,
               (ulong)(uint)UpdateCount);
        fclose((FILE *)ozip);
        if (central_dir != (void *)0x0) {
          fclose((FILE *)central_dir);
          central_dir = (void *)0x0;
          iVar2 = remove(zipname);
          pFVar1 = _stderr;
          if (iVar2 == 0) {
            iVar2 = rename((char *)((long)&dirend.DirectorySize + 2),zipname);
            pFVar1 = _stderr;
            if (iVar2 != 0) {
              piVar3 = __errno_location();
              pcVar4 = strerror(*piVar3);
              fprintf(pFVar1,"Could not rename %s to %s: %s\n",
                      (undefined1 *)((long)&dirend.DirectorySize + 2),zipname,pcVar4);
            }
          }
          else {
            piVar3 = __errno_location();
            pcVar4 = strerror(*piVar3);
            fprintf(pFVar1,"Could not delete old zip: %s\nUpdated zip can be found at %s\n",pcVar4,
                    (undefined1 *)((long)&dirend.DirectorySize + 2));
          }
        }
      }
    }
    free(__ptr);
    if (central_dir != (void *)0x0) {
      fclose((FILE *)central_dir);
    }
    if (local_1068 != (BYTE *)0x0) {
      free(local_1068);
    }
  }
  return;
}

Assistant:

void write_zip(const char *zipname, dir_tree_t *trees, int update)
{
#ifdef _WIN32
	char tempname[_MAX_PATH];
#else
	char tempname[PATH_MAX];
#endif
	EndOfCentralDirectory dirend;
	int i, num_files;
	file_sorted_t *sorted;
	FILE *zip, *ozip = NULL;
	void *central_dir = NULL;

	num_files = count_files(trees);
	sorted = sort_files(trees, num_files);
	if (sorted == NULL)
	{
		no_mem = 1;
		return;
	}
	if (update)
	{
		sprintf(tempname, "%s.temp", zipname);
		ozip = fopen(zipname, "rb");
		if (ozip == NULL)
		{
			fprintf(stderr, "Could not open %s for updating: %s\n", zipname, strerror(errno));
			update = 0;
		}
		else
		{
			central_dir = find_central_dir(ozip);
			if (central_dir == NULL)
			{
				fprintf(stderr, "Could not read central directory from %s. (Is it a zipfile?)\n", zipname);
				update = 0;
			}
		}
		if (!update)
		{
			fprintf(stderr, "Will proceed as if -u had not been specified.\n");
		}
	}
	if (update)
	{
		zip = fopen(tempname, "wb");
	}
	else
	{
		zip = fopen(zipname, "wb");
	}
	if (zip == NULL)
	{
		fprintf(stderr, "Could not open %s: %s\n", zipname, strerror(errno));
	}
	else
	{
		// Write each file.
		for (i = 0; i < num_files; ++i)
		{
			if (append_to_zip(zip, sorted + i, ozip, central_dir))
			{
				break;
			}
		}
		if (i == num_files)
		{
			// Write central directory.
			dirend.DirectoryOffset = LittleLong(ftell(zip));
			for (i = 0; i < num_files; ++i)
			{
				write_central_dir(zip, sorted + i);
			}
			// Write the directory terminator.
			dirend.Magic = ZIP_ENDOFDIR;
			dirend.DiskNumber = 0;
			dirend.FirstDisk = 0;
			dirend.NumEntriesOnAllDisks = dirend.NumEntries = LittleShort(i);
			// In this case LittleLong(dirend.DirectoryOffset) is undoing the transformation done above.
			dirend.DirectorySize = LittleLong(ftell(zip) - LittleLong(dirend.DirectoryOffset));
			dirend.ZipCommentLength = 0;
			if (fwrite(&dirend, sizeof(dirend), 1, zip) != 1)
			{
				fprintf(stderr, "Failed writing zip directory terminator: %s\n", strerror(errno));
			}
			printf("%s contains %d files (updated %d)\n", zipname, num_files, UpdateCount);
			fclose(zip);

			if (ozip != NULL)
			{
				// Delete original, and rename temp to take its place
				fclose(ozip);
				ozip = NULL;
				if (remove(zipname))
				{
					fprintf(stderr, "Could not delete old zip: %s\nUpdated zip can be found at %s\n",
						strerror(errno), tempname);
				}
				else if (rename(tempname, zipname))
				{
					fprintf(stderr, "Could not rename %s to %s: %s\n",
						tempname, zipname, strerror(errno));
				}
			}
		}
	}
	free(sorted);
	if (ozip != NULL)
	{
		fclose(ozip);
	}
	if (central_dir != NULL)
	{
		free(central_dir);
	}
}